

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_data.hpp
# Opt level: O3

void __thiscall
duckdb::MultiFileColumnDefinition::~MultiFileColumnDefinition(MultiFileColumnDefinition *this)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  pointer pcVar2;
  
  duckdb::Value::~Value(&this->identifier);
  _Var1._M_head_impl =
       (this->default_expression).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)_Var1._M_head_impl + 8))();
  }
  (this->default_expression).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  std::vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  ::~vector(&(this->children).
             super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           );
  duckdb::LogicalType::~LogicalType(&this->type);
  pcVar2 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->name).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

MultiFileColumnDefinition(const string &name, const LogicalType &type) : name(name), type(type) {
	}